

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_sequence.cpp
# Opt level: O0

void append_values_from_sequence(ConcurrentData *data)

{
  mutex_type *__m;
  undefined8 *in_RDI;
  lock_guard<std::mutex> lock;
  int64_t res;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  size_t i;
  Connection con;
  pointer in_stack_ffffffffffffff30;
  allocator *__x;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff40;
  Value local_b8 [64];
  mutex_type *local_78;
  allocator local_59;
  string local_58 [32];
  string local_38 [8];
  ulong local_30;
  Connection local_28 [40];
  
  duckdb::Connection::Connection(local_28,(DuckDB *)*in_RDI);
  for (local_30 = 0; local_30 < 100; local_30 = local_30 + 1) {
    __x = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"SELECT nextval(\'seq\')",__x);
    duckdb::Connection::Query(local_38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    in_stack_ffffffffffffff30 =
         duckdb::
         unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
         ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                       *)in_stack_ffffffffffffff30);
    duckdb::MaterializedQueryResult::GetValue((ulong)local_b8,(ulong)in_stack_ffffffffffffff30);
    __m = (mutex_type *)duckdb::Value::GetValue<long>();
    duckdb::Value::~Value(local_b8);
    local_78 = __m;
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_stack_ffffffffffffff30,__m)
    ;
    std::vector<long,_std::allocator<long>_>::push_back
              (in_stack_ffffffffffffff40,(value_type_conflict2 *)__x);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x7892db);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x7892e8);
  }
  duckdb::Connection::~Connection(local_28);
  return;
}

Assistant:

static void append_values_from_sequence(ConcurrentData *data) {
	Connection con(data->db);
	for (size_t i = 0; i < CONCURRENT_SEQUENCE_INSERT_COUNT; i++) {
		auto result = con.Query("SELECT nextval('seq')");
		int64_t res = result->GetValue(0, 0).GetValue<int64_t>();
		lock_guard<mutex> lock(data->lock);
		data->results.push_back(res);
	}
}